

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

bool __thiscall kj::_::Mutex::checkPredicate(Mutex *this,Waiter *waiter)

{
  undefined1 uVar1;
  NullableValue<kj::Exception> _exception124;
  
  uVar1 = 1;
  if ((waiter->exception).ptr.ptr == (Exception *)0x0) {
    uVar1 = (*(code *)**(undefined8 **)waiter->predicate)();
  }
  return (bool)uVar1;
}

Assistant:

bool Mutex::checkPredicate(Waiter& waiter) {
  // Run the predicate from a thread other than the waiting thread, returning true if it's time to
  // signal the waiting thread. This is not only when the predicate passes, but also when it
  // throws, in which case we want to propagate the exception to the waiting thread.

  if (waiter.exception != kj::none) return true;  // don't run again after an exception

  bool result = false;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    result = waiter.predicate.check();
  })) {
    // Exception thrown.
    result = true;
    waiter.exception = kj::heap(kj::mv(exception));
  };
  return result;
}